

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void voc_iterate(voccxdef *ctx,objnum objn,_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *fn,
                void *fnctx)

{
  uint uVar1;
  vocdef **ppvVar2;
  int iVar3;
  vocdef *pvVar4;
  vocwdef *pvVar5;
  
  ppvVar2 = ctx->voccxhsh;
  iVar3 = 0x100;
  do {
    for (pvVar4 = *ppvVar2; pvVar4 != (vocdef *)0x0; pvVar4 = pvVar4->vocnxt) {
      uVar1 = pvVar4->vocwlst;
      if ((uVar1 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar1 / 2000] != (vocwdef *)0x0)) {
        pvVar5 = ctx->voccxwp[(ulong)uVar1 / 2000] + uVar1 % 2000;
        do {
          if ((objn == 0xffff) || (pvVar5->vocwobj == objn)) {
            (*fn)(fnctx,pvVar4,pvVar5);
          }
          uVar1 = pvVar5->vocwnxt;
          if (uVar1 == 0xffffffff) break;
          pvVar5 = ctx->voccxwp[(ulong)uVar1 / 2000] + uVar1 % 2000;
        } while (ctx->voccxwp[(ulong)uVar1 / 2000] != (vocwdef *)0x0);
      }
    }
    ppvVar2 = ppvVar2 + 1;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void voc_iterate(voccxdef *ctx, objnum objn,
                 void (*fn)(void *, vocdef *, vocwdef *), void *fnctx)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;
    uint      idx;

    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v ; v = v->vocnxt)
        {
            /* go through each object relation for this word */
            for (idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 idx = vw->vocwnxt, vw = vocwget(ctx, idx))
            {
                /*
                 *   if this word is for this object, call the callback
                 */
                if (objn == MCMONINV || vw->vocwobj == objn)
                    (*fn)(fnctx, v, vw);
            }
        }
    }
}